

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O0

int SSL_CTX_use_PrivateKey_ASN1(int pk,SSL_CTX *ctx,uchar *d,long len)

{
  bool bVar1;
  EVP_PKEY *pEVar2;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_38;
  UniquePtr<EVP_PKEY> pkey;
  uint8_t *p;
  size_t der_len_local;
  uint8_t *der_local;
  SSL_CTX *ctx_local;
  int type_local;
  
  if ((ulong)len < 0x8000000000000000) {
    pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)d;
    pEVar2 = d2i_PrivateKey(pk,(EVP_PKEY **)0x0,(uchar **)&pkey,len);
    std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_38,(pointer)pEVar2);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_38);
    if ((bVar1) &&
       (pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
        (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)((long)d + len))) {
      pEVar2 = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_38);
      ctx_local._4_4_ = SSL_CTX_use_PrivateKey(ctx,pEVar2);
    }
    else {
      ERR_put_error(0x10,0,0xc,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                    ,0x1a8);
      ctx_local._4_4_ = 0;
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  }
  else {
    ERR_put_error(0x10,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                  ,0x1a1);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int SSL_CTX_use_PrivateKey_ASN1(int type, SSL_CTX *ctx, const uint8_t *der,
                                size_t der_len) {
  if (der_len > LONG_MAX) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return 0;
  }

  const uint8_t *p = der;
  UniquePtr<EVP_PKEY> pkey(d2i_PrivateKey(type, NULL, &p, (long)der_len));
  if (!pkey || p != der + der_len) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_ASN1_LIB);
    return 0;
  }

  return SSL_CTX_use_PrivateKey(ctx, pkey.get());
}